

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cpp
# Opt level: O0

void __thiscall VertexBuffer::VertexBuffer(VertexBuffer *this,uint32_t size,bool immutable)

{
  socklen_t in_ECX;
  sockaddr *__addr;
  uint32_t __fd;
  bool immutable_local;
  uint32_t size_local;
  VertexBuffer *this_local;
  
  __fd = size;
  BufferLayout::BufferLayout(&this->m_layout);
  init_buffer(this);
  bind(this,__fd,__addr,in_ECX);
  (*glad_glBufferData)(0x8892,(GLsizeiptr)size,(void *)0x0,0x88e8);
  return;
}

Assistant:

VertexBuffer::VertexBuffer(uint32_t size, bool immutable)
{
    init_buffer();

    // Dynamic - for data to be uploaded later
#if OPENGL_VERSION >= 45
    if (immutable)
        glNamedBufferStorage(m_id, size, nullptr, GL_DYNAMIC_STORAGE_BIT);
    else
        glNamedBufferData(m_id, size, nullptr, GL_DYNAMIC_DRAW);
#elif OPENGL_VERSION >= 44
    bind();

    if (immutable)
        glBufferStorage(GL_ARRAY_BUFFER, size, nullptr, GL_DYNAMIC_STORAGE_BIT);
    else
        glBufferData(GL_ARRAY_BUFFER, size, nullptr, GL_DYNAMIC_DRAW);
#else
    bind();
    glBufferData(GL_ARRAY_BUFFER, size, nullptr, GL_DYNAMIC_DRAW);
#endif
}